

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O2

void test_control_frame_within_fragment(void)

{
  anon_struct_4_7_799a2f31_for_ws_flags *paVar1;
  cio_websocket *websocket;
  cio_error cVar2;
  long lVar3;
  char data [12];
  ws_frame local_d8;
  undefined8 local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined2 local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined2 local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined2 local_60;
  undefined4 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  undefined2 local_40;
  
  local_d8.data = data;
  local_b0 = data;
  local_90 = data;
  local_70 = data;
  local_d8.frame_type = CIO_WEBSOCKET_TEXT_FRAME;
  local_d8.direction = FROM_CLIENT;
  local_d8.data_length = 0xc;
  local_d8.last_frame = false;
  local_d8.rsv = false;
  local_b8 = 0;
  local_a8 = 0xc;
  local_a0 = 0;
  local_98 = 9;
  local_88 = 0xc;
  local_80 = 1;
  local_78 = 0;
  builtin_strncpy(data,"aaaaaaaaaaaa",0xc);
  local_68 = 0xc;
  local_60 = 1;
  local_58 = 8;
  local_54 = 0;
  uStack_4c = 0;
  local_44 = 0;
  local_40 = 1;
  serialize_frames(&local_d8,5);
  websocket = ws;
  paVar1 = &(ws->ws_private).ws_flags;
  *(ushort *)paVar1 = *(ushort *)paVar1 | 0x400;
  lVar3 = 0;
  cVar2 = cio_websocket_read_message(websocket,read_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Could not start reading a message!",0x695,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (4,(ulong)read_handler_fake.call_count,"read_handler was not called",0x697,
             UNITY_DISPLAY_STYLE_INT);
  while( true ) {
    if (lVar3 == 3) {
      UnityAssertEqualNumber
                ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_history[3],
                 "websocket parameter of read_handler not correct",0x6a7,UNITY_DISPLAY_STYLE_HEX64);
      if (read_handler_fake.arg1_history[3] == (void *)0x0) {
        UnityAssertEqualNumber
                  (1,(long)read_handler_fake.arg2_history[3],
                   "err parameter of read_handler not correct",0x6a9,UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  (0,(ulong)on_error_fake.call_count,"error callback was called",0x6ab,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  (2,(ulong)on_control_fake.call_count,
                   "control callback was not called for last ping and close frame",0x6ad,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  ((UNITY_INT)ws,(UNITY_INT)on_control_fake.arg0_history[0],
                   "websocket parameter of control callback is NULL",0x6ae,UNITY_DISPLAY_STYLE_HEX64
                  );
        UnityAssertEqualNumber
                  (9,(ulong)on_control_fake.arg1_history[0],
                   "control frame type of control callback not correct",0x6af,
                   UNITY_DISPLAY_STYLE_INT);
        UnityAssertEqualNumber
                  ((UNITY_INT)ws,(UNITY_INT)on_control_fake.arg0_history[1],
                   "websocket parameter of control callback is NULL",0x6b1,UNITY_DISPLAY_STYLE_HEX64
                  );
        UnityAssertEqualNumber
                  (8,(ulong)on_control_fake.arg1_history[1],
                   "control frame type of control callback not correct",0x6b2,
                   UNITY_DISPLAY_STYLE_INT);
        return;
      }
      UnityFail("context parameter of read_handler not correct",0x6a8);
    }
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)read_handler_fake.arg0_history[lVar3],
               "websocket parameter of read_handler not correct",0x69a,UNITY_DISPLAY_STYLE_HEX64);
    if (read_handler_fake.arg1_history[lVar3] != (void *)0x0) {
      UnityFail("context parameter of read_handler not correct",0x69b);
    }
    UnityAssertEqualNumber
              (0,(long)read_handler_fake.arg2_history[lVar3],
               "err parameter of read_handler not correct",0x69c,UNITY_DISPLAY_STYLE_INT);
    if (read_handler_fake.arg4_history[lVar3] == (uint8_t *)0x0) {
      UnityFail("data parameter of read_handler not correct",0x69d);
    }
    UnityAssertEqualNumber
              (0xc,read_handler_fake.arg5_history[lVar3],
               "length parameter of read_handler not correct",0x69e,UNITY_DISPLAY_STYLE_INT);
    if (read_handler_fake.arg8_history[lVar3] == true) break;
    if (lVar3 == 2) {
      if (read_handler_fake.arg7_history[2] == false) {
        UnityFail("last_frame parameter of read_handler not correct",0x6a3);
      }
    }
    else if (read_handler_fake.arg7_history[lVar3] == true) {
      UnityFail("last_frame parameter of read_handler not correct",0x6a1);
    }
    lVar3 = lVar3 + 1;
  }
  UnityFail("is_binary parameter of read_handler not correct",0x69f);
}

Assistant:

static void test_control_frame_within_fragment(void)
{
	char data[12];
	memset(data, 'a', sizeof(data));

	struct ws_frame frames[] = {
	    {.frame_type = CIO_WEBSOCKET_TEXT_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = false, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_PING_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CONTINUATION_FRAME, .direction = FROM_CLIENT, .data = data, .data_length = sizeof(data), .last_frame = true, .rsv = false},
	    {.frame_type = CIO_WEBSOCKET_CLOSE_FRAME, .direction = FROM_CLIENT, .data = NULL, .data_length = 0, .last_frame = true, .rsv = false},
	};

	serialize_frames(frames, ARRAY_SIZE(frames));

	ws->ws_private.ws_flags.is_server = (frames[0].direction == FROM_CLIENT) ? 1 : 0;
	enum cio_error err = cio_websocket_read_message(ws, read_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Could not start reading a message!");

	TEST_ASSERT_EQUAL_MESSAGE(4, read_handler_fake.call_count, "read_handler was not called");

	for (unsigned int i = 0; i < 3; i++) {
		TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_history[i], "websocket parameter of read_handler not correct");
		TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[i], "context parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, read_handler_fake.arg2_history[i], "err parameter of read_handler not correct");
		TEST_ASSERT_NOT_NULL_MESSAGE(read_handler_fake.arg4_history[i], "data parameter of read_handler not correct");
		TEST_ASSERT_EQUAL_MESSAGE(sizeof(data), read_handler_fake.arg5_history[i], "length parameter of read_handler not correct");
		TEST_ASSERT_FALSE_MESSAGE(read_handler_fake.arg8_history[i], "is_binary parameter of read_handler not correct");
		if (i < 2) {
			TEST_ASSERT_FALSE_MESSAGE(read_handler_fake.arg7_history[i], "last_frame parameter of read_handler not correct");
		} else {
			TEST_ASSERT_TRUE_MESSAGE(read_handler_fake.arg7_history[i], "last_frame parameter of read_handler not correct");
		}
	}

	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, read_handler_fake.arg0_history[3], "websocket parameter of read_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(read_handler_fake.arg1_history[3], "context parameter of read_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_EOF, read_handler_fake.arg2_history[3], "err parameter of read_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(0, on_error_fake.call_count, "error callback was called");

	TEST_ASSERT_EQUAL_MESSAGE(2, on_control_fake.call_count, "control callback was not called for last ping and close frame");
	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, on_control_fake.arg0_history[0], "websocket parameter of control callback is NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_PING_FRAME, on_control_fake.arg1_history[0], "control frame type of control callback not correct");

	TEST_ASSERT_EQUAL_PTR_MESSAGE(ws, on_control_fake.arg0_history[1], "websocket parameter of control callback is NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_WEBSOCKET_CLOSE_FRAME, on_control_fake.arg1_history[1], "control frame type of control callback not correct");
}